

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  char cVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiTableInstanceData *pIVar6;
  ImGuiTableCellData *pIVar7;
  ImGuiTableColumn *pIVar8;
  long in_RDI;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  ImVec4 IVar13;
  ImRect IVar14;
  ImGuiTableColumn *column_2;
  int column_n_1;
  float row_height;
  float y0;
  ImGuiTableColumn *column_1;
  int column_n;
  ImRect cell_bg_rect;
  ImGuiTableColumn *column;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *cell_data_end;
  ImRect row_rect;
  bool draw_strong_bottom_border;
  bool draw_cell_bg_color;
  float border_size;
  ImU32 border_col;
  ImU32 bg_col1;
  ImU32 bg_col0;
  bool is_visible;
  bool unfreeze_rows_request;
  bool unfreeze_rows_actual;
  float bg_y2;
  float bg_y1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ImRect *in_stack_ffffffffffffff08;
  ImGuiWindow *in_stack_ffffffffffffff10;
  ImDrawList *in_stack_ffffffffffffff18;
  ImDrawList *in_stack_ffffffffffffff20;
  int local_d4;
  int local_bc;
  float in_stack_ffffffffffffff48;
  ImU32 in_stack_ffffffffffffff4c;
  ImVec2 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar15;
  ImVec2 in_stack_ffffffffffffff60;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  undefined1 in_stack_ffffffffffffff80 [16];
  ImVec2 *in_stack_ffffffffffffff90;
  ImGuiTableCellData *local_68;
  float local_54;
  float local_4c;
  undefined8 local_48;
  undefined8 local_40;
  int local_30;
  int local_2c;
  ImU32 local_28;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (*(int *)(in_RDI + 0x7c) != -1) {
    TableEndCell((ImGuiTable *)in_stack_ffffffffffffff10);
  }
  if ((pIVar5->LogEnabled & 1U) != 0) {
    LogRenderedText(in_stack_ffffffffffffff90,in_stack_ffffffffffffff80._8_8_,
                    in_stack_ffffffffffffff80._0_8_);
  }
  (pIVar3->DC).CursorPos.y = *(float *)(in_RDI + 0x88);
  fVar11 = *(float *)(in_RDI + 0x84);
  fVar1 = *(float *)(in_RDI + 0x88);
  bVar9 = *(int *)(in_RDI + 0x78) + 1 == (int)*(char *)(in_RDI + 0x202);
  iVar15 = *(int *)(in_RDI + 0x78);
  cVar2 = *(char *)(in_RDI + 0x201);
  if (*(int *)(in_RDI + 0x78) == 0) {
    pIVar6 = TableGetInstanceData(in_stack_fffffffffffffef8,0);
    pIVar6->LastFirstRowHeight = fVar1 - fVar11;
  }
  bVar10 = false;
  if (*(float *)(in_RDI + 0x124) <= fVar1) {
    bVar10 = fVar11 <= *(float *)(in_RDI + 300);
  }
  if (bVar10) {
    local_28 = 0;
    local_2c = 0;
    if (*(int *)(in_RDI + 0xa0) == 0x1000000) {
      if ((*(uint *)(in_RDI + 4) & 0x40) != 0) {
        local_28 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                               SUB84(in_stack_ffffffffffffff10,0));
      }
    }
    else {
      local_28 = *(ImU32 *)(in_RDI + 0xa0);
    }
    if (*(int *)(in_RDI + 0xa4) != 0x1000000) {
      local_2c = *(int *)(in_RDI + 0xa4);
    }
    local_30 = 0;
    if (((0 < *(int *)(in_RDI + 0x78)) || (*(long *)(in_RDI + 0x188) == *(long *)(in_RDI + 0x180)))
       && ((*(uint *)(in_RDI + 4) & 0x80) != 0)) {
      if ((*(int *)(in_RDI + 0x98) >> 0x10 & 1U) == 0) {
        local_d4 = *(int *)(in_RDI + 0xac);
      }
      else {
        local_d4 = *(int *)(in_RDI + 0xa8);
      }
      local_30 = local_d4;
    }
    bVar10 = -1 < *(char *)(in_RDI + 0x205);
    if ((((local_28 != 0 || local_2c != 0) || local_30 != 0) || (bVar9)) || (bVar10)) {
      if ((*(uint *)(in_RDI + 4) & 0x100000) == 0) {
        IVar13 = ImRect::ToVec4((ImRect *)0x52cbb2);
        pIVar4 = pIVar3->DrawList;
        local_48 = IVar13._0_8_;
        (pIVar4->_CmdHeader).ClipRect.x = (float)(undefined4)local_48;
        (pIVar4->_CmdHeader).ClipRect.y = (float)local_48._4_4_;
        local_40 = IVar13._8_8_;
        (pIVar4->_CmdHeader).ClipRect.z = (float)(undefined4)local_40;
        (pIVar4->_CmdHeader).ClipRect.w = (float)local_40._4_4_;
      }
      ImDrawListSplitter::SetCurrentChannel
                ((ImDrawListSplitter *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    }
    if ((local_28 != 0) || (local_2c != 0)) {
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff10,
                     (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     SUB84(in_stack_ffffffffffffff08,0),
                     (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (float)in_stack_ffffffffffffff00);
      ImRect::ClipWith((ImRect *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if ((local_28 != 0) && (local_54 < local_4c)) {
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff20,(ImVec2 *)in_stack_ffffffffffffff18,
                   (ImVec2 *)in_stack_ffffffffffffff10,
                   (ImU32)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   SUB84(in_stack_ffffffffffffff08,0),
                   (ImDrawFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      }
      if ((local_2c != 0) && (local_54 < local_4c)) {
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff20,(ImVec2 *)in_stack_ffffffffffffff18,
                   (ImVec2 *)in_stack_ffffffffffffff10,
                   (ImU32)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   SUB84(in_stack_ffffffffffffff08,0),
                   (ImDrawFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      }
    }
    if (bVar10) {
      pIVar7 = ImSpan<ImGuiTableCellData>::operator[]
                         ((ImSpan<ImGuiTableCellData> *)(in_RDI + 0x38),
                          (int)*(char *)(in_RDI + 0x205));
      for (local_68 = ImSpan<ImGuiTableCellData>::operator[]
                                ((ImSpan<ImGuiTableCellData> *)(in_RDI + 0x38),0);
          local_68 <= pIVar7; local_68 = local_68 + 1) {
        pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),(int)local_68->Column);
        IVar14 = TableGetCellBgRect((ImGuiTable *)in_stack_ffffffffffffff10,
                                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        ImRect::ClipWith((ImRect *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        ImMax<float>(IVar14.Min.x,(pIVar8->ClipRect).Min.x);
        ImMin<float>(IVar14.Max.x,pIVar8->MaxX);
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff20,(ImVec2 *)in_stack_ffffffffffffff18,
                   (ImVec2 *)in_stack_ffffffffffffff10,
                   (ImU32)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   SUB84(in_stack_ffffffffffffff08,0),
                   (ImDrawFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      }
    }
    if (((local_30 != 0) && (*(float *)(in_RDI + 0x134) <= fVar11)) &&
       (fVar11 < *(float *)(in_RDI + 0x13c))) {
      in_stack_ffffffffffffff20 = pIVar3->DrawList;
      ImVec2::ImVec2(&local_88,*(float *)(in_RDI + 0xb0),fVar11);
      ImVec2::ImVec2(&local_90,*(float *)(in_RDI + 0xb4),fVar11);
      ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffff60,
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                          in_stack_ffffffffffffff48);
    }
    if (((bVar9) && (*(float *)(in_RDI + 0x134) <= fVar1)) && (fVar1 < *(float *)(in_RDI + 0x13c)))
    {
      in_stack_ffffffffffffff18 = pIVar3->DrawList;
      ImVec2::ImVec2(&local_98,*(float *)(in_RDI + 0xb0),fVar1);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,*(float *)(in_RDI + 0xb4),fVar1);
      ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffff60,
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                          in_stack_ffffffffffffff48);
    }
  }
  if (iVar15 + 1 == (int)cVar2) {
    for (iVar15 = 0; iVar15 < *(int *)(in_RDI + 0x74); iVar15 = iVar15 + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),iVar15);
      pIVar8->NavLayerCurrent = iVar15 < *(char *)(in_RDI + 0x204);
    }
  }
  if (bVar9) {
    *(undefined1 *)(in_RDI + 0x214) = 1;
    fVar11 = ImMax<float>(*(float *)(in_RDI + 0x88) + 1.0,(pIVar3->InnerClipRect).Min.y);
    fVar11 = ImMin<float>(fVar11,(pIVar3->InnerClipRect).Max.y);
    *(float *)(in_RDI + 0x154) = fVar11;
    *(float *)(in_RDI + 0x134) = fVar11;
    fVar11 = (pIVar3->InnerClipRect).Max.y;
    *(float *)(in_RDI + 0x15c) = fVar11;
    *(float *)(in_RDI + 0x13c) = fVar11;
    *(undefined1 *)(in_RDI + 0x207) = *(undefined1 *)(in_RDI + 0x208);
    fVar11 = *(float *)(in_RDI + 0x88);
    fVar1 = *(float *)(in_RDI + 0x84);
    fVar12 = (*(float *)(in_RDI + 0x114) + *(float *)(in_RDI + 0x88)) - *(float *)(in_RDI + 0xf4);
    (pIVar3->DC).CursorPos.y = fVar12;
    *(float *)(in_RDI + 0x88) = fVar12;
    *(float *)(in_RDI + 0x84) = *(float *)(in_RDI + 0x88) - (fVar11 - fVar1);
    for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x74); local_bc = local_bc + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_bc);
      pIVar8->DrawChannelCurrent = pIVar8->DrawChannelUnfrozen;
      (pIVar8->ClipRect).Min.y = *(float *)(in_RDI + 0x154);
    }
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),0);
    SetWindowClipRectBeforeSetChannel(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    iVar15 = (int)((ulong)pIVar3->DrawList >> 0x20);
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),0);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,iVar15);
  }
  if ((*(uint *)(in_RDI + 0x98) & 1) == 0) {
    *(int *)(in_RDI + 0x9c) = *(int *)(in_RDI + 0x9c) + 1;
  }
  *(undefined1 *)(in_RDI + 0x20a) = 0;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}